

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::AnimationLayer::AnimationLayer
          (AnimationLayer *this,uint64_t id,Element *element,string *name,Document *doc)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Scope *sc;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  string local_48;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationLayer_0025ce40;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->doc = doc;
  sc = GetRequiredScope(element);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"AnimationLayer.FbxAnimLayer","");
  Util::GetPropertyTable((Util *)&local_58,doc,&local_48,element,sc,true);
  p_Var2 = p_Stack_50;
  peVar1 = local_58;
  local_58 = (element_type *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

AnimationLayer::AnimationLayer(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Object(id, element, name)
, doc(doc)
{
    const Scope& sc = GetRequiredScope(element);

    // note: the props table here bears little importance and is usually absent
    props = GetPropertyTable(doc,"AnimationLayer.FbxAnimLayer",element,sc, true);
}